

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O0

void subtest(char *name,_func_void *cb)

{
  test_t *ptVar1;
  test_t *parent_tests;
  test_t test;
  _func_void *cb_local;
  char *name_local;
  
  test = (test_t)cb;
  memset(&parent_tests,0,8);
  ptVar1 = cur_tests;
  cur_tests = (test_t *)&parent_tests;
  test_level = test_level + 1;
  note("Subtest: %s",name);
  (*(code *)test)();
  done_testing();
  test_level = test_level + -1;
  cur_tests = ptVar1;
  if (parent_tests._4_4_ != 0) {
    ptVar1->failed = 1;
  }
  _ok((uint)((parent_tests._4_4_ != 0 ^ 0xffU) & 1),"%s",name);
  return;
}

Assistant:

void subtest(const char *name, void (*cb)(void))
{
    struct test_t test = {0}, *parent_tests;

    parent_tests = cur_tests;
    cur_tests = &test;
    ++test_level;

    note("Subtest: %s", name);

    cb();

    done_testing();

    --test_level;
    cur_tests = parent_tests;
    if (test.failed)
        cur_tests->failed = 1;
    _ok(! test.failed, "%s", name);
}